

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_set_global_string_byname(char *name,char *val)

{
  size_t sVar1;
  Attribute attr;
  Caliper c;
  allocator<char> local_69;
  Attribute local_68;
  string local_60;
  Caliper local_40;
  
  cali::Caliper::Caliper(&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,name,&local_69);
  local_68 = cali::Caliper::create_attribute
                       (&local_40,&local_60,CALI_TYPE_STRING,0x640,0,(Attribute *)0x0,(Variant *)0x0
                       );
  if ((cali_variant_t *)local_60._M_dataplus._M_p != (cali_variant_t *)&local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  sVar1 = strlen(val);
  local_60._0_16_ = cali_make_variant(CALI_TYPE_STRING,val,sVar1 + 1);
  cali::Caliper::set(&local_40,&local_68,(Variant *)&local_60);
  return;
}

Assistant:

void cali_set_global_string_byname(const char* name, const char* val)
{
    Caliper   c;
    Attribute attr =
        c.create_attribute(name, CALI_TYPE_STRING, CALI_ATTR_GLOBAL | CALI_ATTR_UNALIGNED | CALI_ATTR_SKIP_EVENTS);

    // TODO: check for existing incompatible attribute key

    c.set(attr, Variant(CALI_TYPE_STRING, val, strlen(val) + 1));
}